

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lest.hpp
# Opt level: O3

result * __thiscall
lest::
expression_lhs<nonstd::expected_lite::unexpected_type<std::__exception_ptr::exception_ptr>const&>::
operator!=(result *__return_storage_ptr__,
          expression_lhs<nonstd::expected_lite::unexpected_type<std::__exception_ptr::exception_ptr>const&>
          *this,unexpected_type<std::__exception_ptr::exception_ptr> *rhs)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  lest *this_00;
  void *pvVar2;
  void *pvVar3;
  size_type sVar4;
  char *pcVar5;
  unexpected_type<std::__exception_ptr::exception_ptr> *in_R8;
  undefined1 *local_d8;
  undefined8 local_d0;
  undefined1 local_c8 [8];
  undefined8 uStack_c0;
  string local_b8;
  error_type local_98;
  undefined8 local_90;
  undefined1 local_88 [8];
  undefined8 uStack_80;
  char *local_78;
  size_type local_70;
  char local_68 [8];
  undefined4 uStack_60;
  undefined4 uStack_5c;
  bool local_58;
  undefined1 *local_50;
  long local_48;
  undefined1 local_40 [16];
  
  this_00 = *(lest **)this;
  pvVar2 = *(void **)this_00;
  pvVar3 = (rhs->m_error)._M_exception_object;
  local_d8 = local_c8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_d8,"!=","");
  local_98._M_exception_object = local_88;
  if (local_d8 == local_c8) {
    uStack_80 = uStack_c0;
  }
  else {
    local_98._M_exception_object = local_d8;
  }
  local_90 = local_d0;
  local_d0 = 0;
  local_c8[0] = 0;
  local_d8 = local_c8;
  to_string<nonstd::expected_lite::unexpected_type<std::__exception_ptr::exception_ptr>,nonstd::expected_lite::unexpected_type<std::__exception_ptr::exception_ptr>>
            (&local_b8,this_00,(unexpected_type<std::__exception_ptr::exception_ptr> *)&local_98,
             (string *)rhs,in_R8);
  sVar4 = local_b8._M_string_length;
  paVar1 = &local_b8.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._M_dataplus._M_p == paVar1) {
    uStack_60 = local_b8.field_2._8_4_;
    uStack_5c = local_b8.field_2._12_4_;
    local_b8._M_dataplus._M_p = local_68;
  }
  local_70 = local_b8._M_string_length;
  local_b8._M_string_length = 0;
  local_b8.field_2._M_allocated_capacity._0_4_ =
       local_b8.field_2._M_allocated_capacity._0_4_ & 0xffffff00;
  pcVar5 = local_b8._M_dataplus._M_p + sVar4;
  local_78 = local_b8._M_dataplus._M_p;
  local_b8._M_dataplus._M_p = (pointer)paVar1;
  local_58 = pvVar2 != pvVar3;
  local_50 = local_40;
  std::__cxx11::string::_M_construct<char*>((string *)&local_50,local_78,pcVar5);
  __return_storage_ptr__->passed = local_58;
  (__return_storage_ptr__->decomposition)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->decomposition).field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&__return_storage_ptr__->decomposition,local_50,local_50 + local_48);
  if (local_50 != local_40) {
    operator_delete(local_50);
  }
  if (local_78 != local_68) {
    operator_delete(local_78);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._M_dataplus._M_p != paVar1) {
    operator_delete(local_b8._M_dataplus._M_p);
  }
  if ((undefined1 *)local_98._M_exception_object != local_88) {
    operator_delete(local_98._M_exception_object);
  }
  if (local_d8 != local_c8) {
    operator_delete(local_d8);
  }
  return __return_storage_ptr__;
}

Assistant:

result operator!=( R const & rhs ) { return result{ lhs != rhs, to_string( lhs, "!=", rhs ) }; }